

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O2

Rational __thiscall CommandOptions::PictureRate(CommandOptions *this)

{
  ui32_t uVar1;
  Rational *pRVar2;
  
  uVar1 = this->picture_rate;
  switch(uVar1) {
  case 0x10:
    pRVar2 = (Rational *)&ASDCP::EditRate_16;
    break;
  case 0x12:
    pRVar2 = (Rational *)&ASDCP::EditRate_18;
    break;
  case 0x14:
    pRVar2 = (Rational *)&ASDCP::EditRate_20;
    break;
  case 0x16:
    pRVar2 = (Rational *)&ASDCP::EditRate_22;
    break;
  case 0x17:
    pRVar2 = (Rational *)&ASDCP::EditRate_23_98;
    break;
  case 0x19:
    pRVar2 = (Rational *)&ASDCP::EditRate_25;
    break;
  case 0x1e:
    pRVar2 = (Rational *)&ASDCP::EditRate_30;
    break;
  default:
    if (uVar1 == 0x30) {
      pRVar2 = (Rational *)&ASDCP::EditRate_48;
      break;
    }
    if (uVar1 == 0x32) {
      pRVar2 = (Rational *)&ASDCP::EditRate_50;
      break;
    }
    if (uVar1 == 0x3c) {
      pRVar2 = (Rational *)&ASDCP::EditRate_60;
      break;
    }
    if (uVar1 == 0x60) {
      pRVar2 = (Rational *)&ASDCP::EditRate_96;
      break;
    }
    if (uVar1 == 100) {
      pRVar2 = (Rational *)&ASDCP::EditRate_100;
      break;
    }
    if (uVar1 == 0x78) {
      pRVar2 = (Rational *)&ASDCP::EditRate_120;
      break;
    }
    if (uVar1 == 0xc0) {
      pRVar2 = (Rational *)&ASDCP::EditRate_192;
      break;
    }
    if (uVar1 == 200) {
      pRVar2 = (Rational *)&ASDCP::EditRate_200;
      break;
    }
    if (uVar1 == 0xf0) {
      pRVar2 = (Rational *)&ASDCP::EditRate_240;
      break;
    }
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    pRVar2 = (Rational *)&ASDCP::EditRate_24;
  }
  return *pRVar2;
}

Assistant:

Rational PictureRate()
  {
    if ( picture_rate == 16 ) return EditRate_16;
    if ( picture_rate == 18 ) return EditRate_18;
    if ( picture_rate == 20 ) return EditRate_20;
    if ( picture_rate == 22 ) return EditRate_22;
    if ( picture_rate == 23 ) return EditRate_23_98;
    if ( picture_rate == 24 ) return EditRate_24;
    if ( picture_rate == 25 ) return EditRate_25;
    if ( picture_rate == 30 ) return EditRate_30;
    if ( picture_rate == 48 ) return EditRate_48;
    if ( picture_rate == 50 ) return EditRate_50;
    if ( picture_rate == 60 ) return EditRate_60;
    if ( picture_rate == 96 ) return EditRate_96;
    if ( picture_rate == 100 ) return EditRate_100;
    if ( picture_rate == 120 ) return EditRate_120;
    if ( picture_rate == 192 ) return EditRate_192;
    if ( picture_rate == 200 ) return EditRate_200;
    if ( picture_rate == 240 ) return EditRate_240;
    return EditRate_24;
  }